

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numfmt.cpp
# Opt level: O0

UBool icu_63::NumberFormat::unregister(URegistryKey key,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  UErrorCode *status_local;
  URegistryKey key_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    UVar1 = haveService();
    if (UVar1 == '\0') {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
      key_local._7_1_ = '\0';
    }
    else {
      iVar2 = (*(gService->super_ICUService).super_ICUNotifier._vptr_ICUNotifier[10])
                        (gService,key,status);
      key_local._7_1_ = (UBool)iVar2;
    }
  }
  else {
    key_local._7_1_ = '\0';
  }
  return key_local._7_1_;
}

Assistant:

UBool U_EXPORT2
NumberFormat::unregister(URegistryKey key, UErrorCode& status)
{
    if (U_FAILURE(status)) {
        return FALSE;
    }
    if (haveService()) {
        return gService->unregister(key, status);
    } else {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return FALSE;
    }
}